

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QDateTimeParser::SectionNode>::end(QList<QDateTimeParser::SectionNode> *this)

{
  SectionNode *n;
  QArrayDataPointer<QDateTimeParser::SectionNode> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QDateTimeParser::SectionNode> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QDateTimeParser::SectionNode> *)0x778ec9);
  QArrayDataPointer<QDateTimeParser::SectionNode>::operator->(in_RDI);
  n = QArrayDataPointer<QDateTimeParser::SectionNode>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }